

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O2

Interval * deqp::egl::approximateInt(Interval *__return_storage_ptr__,int i)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Interval local_60;
  Interval local_48;
  Interval local_30;
  
  local_30.m_hasNaN = false;
  local_30.m_lo = -1.0;
  local_30.m_hi = 1.0;
  local_60.m_lo = (double)i;
  local_60.m_hasNaN = false;
  local_60.m_hi = local_60.m_lo;
  tcu::operator+(&local_48,&local_60,&local_30);
  __return_storage_ptr__->m_hasNaN = false;
  uVar1 = (ulong)local_48.m_hi & -(ulong)(local_48.m_hi <= INFINITY);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = ~-(ulong)(local_48.m_hi <= INFINITY) & 0x7ff0000000000000;
  auVar3._8_4_ = (int)uVar1;
  auVar3._0_8_ = (ulong)local_48.m_lo & -(ulong)(0.0 <= local_48.m_lo);
  auVar3._12_4_ = (int)(uVar1 >> 0x20);
  auVar3 = auVar2 << 0x40 | auVar3;
  __return_storage_ptr__->m_lo = (double)auVar3._0_8_;
  __return_storage_ptr__->m_hi = (double)auVar3._8_8_;
  return __return_storage_ptr__;
}

Assistant:

Interval approximateInt (int i)
{
	const Interval margin(-1.0, 1.0); // The resolution may be rounded

	return (Interval(i) + margin) & Interval(0.0, TCU_INFINITY);
}